

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

bool __thiscall ON_FixedSizePool::InPool(ON_FixedSizePool *this,void *p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void **ppvVar3;
  bool bVar4;
  
  if (p != (void *)0x0) {
    bVar4 = (undefined8 *)this->m_first_block == (undefined8 *)0x0;
    if (!bVar4) {
      puVar1 = (undefined8 *)this->m_first_block;
      do {
        if (puVar1 == (undefined8 *)this->m_al_block) {
          puVar2 = (undefined8 *)0x0;
          ppvVar3 = &this->m_al_element_array;
        }
        else {
          puVar2 = (undefined8 *)*puVar1;
          ppvVar3 = (void **)(puVar1 + 1);
        }
        if ((puVar1 + 2 <= p) && (p < *ppvVar3)) {
          if (bVar4) {
            return false;
          }
          return true;
        }
        bVar4 = puVar2 == (undefined8 *)0x0;
        puVar1 = puVar2;
      } while (!bVar4);
    }
  }
  return false;
}

Assistant:

bool ON_FixedSizePool::InPool(
  const void* p
) const
{
  if (nullptr != p)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    const char* ptr = (const char*)p;
    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        // After a ReturnAll(), a multi-block fsp has unused blocks after m_al_block.
        // Searching must terminate at m_al_block.
        next_block = nullptr;
        block_end = (const char*)m_al_element_array;
        block += (2 * sizeof(void*));
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      if (ptr >= block && ptr < block_end)
        return true;
    }
  }

  return false;
}